

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disp_binder.cpp
# Opt level: O0

disp_binding_activator_t * __thiscall
so_5::impl::pre5_5_19_default_disp_binder_t::bind_agent
          (disp_binding_activator_t *__return_storage_ptr__,pre5_5_19_default_disp_binder_t *this,
          environment_t *env,agent_ref_t *agent)

{
  bool bVar1;
  pointer pdVar2;
  intrusive_ptr_t<so_5::agent_t> local_50 [3];
  environment_t local_38;
  lock_guard<so_5::spinlock_t<so_5::yield_backoff_t>_> lock;
  agent_ref_t *agent_local;
  environment_t *env_local;
  pre5_5_19_default_disp_binder_t *this_local;
  
  lock._M_device = (mutex_type *)agent;
  std::lock_guard<so_5::spinlock_t<so_5::yield_backoff_t>_>::lock_guard
            ((lock_guard<so_5::spinlock_t<so_5::yield_backoff_t>_> *)&local_38.m_impl,&this->m_lock)
  ;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_actual_binder);
  if (!bVar1) {
    environment_t::so_make_default_disp_binder(&local_38);
    std::unique_ptr<so_5::disp_binder_t,_std::default_delete<so_5::disp_binder_t>_>::operator=
              (&this->m_actual_binder,
               (unique_ptr<so_5::disp_binder_t,_std::default_delete<so_5::disp_binder_t>_> *)
               &local_38);
    std::unique_ptr<so_5::disp_binder_t,_std::default_delete<so_5::disp_binder_t>_>::~unique_ptr
              ((unique_ptr<so_5::disp_binder_t,_std::default_delete<so_5::disp_binder_t>_> *)
               &local_38);
  }
  std::lock_guard<so_5::spinlock_t<so_5::yield_backoff_t>_>::~lock_guard
            ((lock_guard<so_5::spinlock_t<so_5::yield_backoff_t>_> *)&local_38.m_impl);
  pdVar2 = std::unique_ptr<so_5::disp_binder_t,_std::default_delete<so_5::disp_binder_t>_>::
           operator->(&this->m_actual_binder);
  intrusive_ptr_t<so_5::agent_t>::intrusive_ptr_t(local_50,agent);
  (*pdVar2->_vptr_disp_binder_t[2])(__return_storage_ptr__,pdVar2,env,local_50);
  intrusive_ptr_t<so_5::agent_t>::~intrusive_ptr_t(local_50);
  return __return_storage_ptr__;
}

Assistant:

virtual disp_binding_activator_t
		bind_agent(
			environment_t & env,
			agent_ref_t agent ) override
			{
				// Actual binder must be created if necessary.
				{
					std::lock_guard< default_spinlock_t > lock( m_lock );
					if( !m_actual_binder )
						m_actual_binder = env.so_make_default_disp_binder();
				}
				return m_actual_binder->bind_agent( env, std::move(agent) );
			}